

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoCube>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *this,void **vtt)

{
  void *pvVar1;
  TPZReference *pTVar2;
  
  TPZGeoElRefLess<pzgeom::TPZGeoCube>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>,vtt + 1);
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl = pvVar1;
  *(void **)((long)(this->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fGeo.
                   super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes +
            *(long *)((long)pvVar1 + -0x60) + -0x48) = vtt[5];
  TPZVec<long>::TPZVec(&this->fSubEl,0);
  pTVar2 = (TPZReference *)operator_new(0x10);
  pTVar2->fPointer = (TPZRefPattern *)0x0;
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fRefPattern).fRef = pTVar2;
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern():TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),
TPZGeoElRefLess<TGeo>(), fSubEl(0), fRefPattern(0)
{
}